

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar16;
  undefined8 uVar15;
  float fVar17;
  double dVar18;
  undefined8 uVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  vec<2U,_float> axis;
  vec<2U,_float> w;
  matrix<2U,_2U,_float> covar;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar5 = (ulong)(parent_node->m_vectors).m_size;
  if (uVar5 == 2) {
    ppVar6 = (this->m_training_vecs).m_p + *(parent_node->m_vectors).m_p;
    if (ppVar6 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)left_child_res) {
      lVar8 = 0;
      do {
        left_child_res->m_s[lVar8] = (ppVar6->first).m_s[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
    }
    ppVar6 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[1];
    if (ppVar6 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)right_child_res) {
      lVar8 = 0;
      do {
        right_child_res->m_s[lVar8] = (ppVar6->first).m_s[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
    }
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    if (uVar5 != 0) {
      puVar4 = (parent_node->m_vectors).m_p;
      ppVar6 = (this->m_training_vecs).m_p;
      uVar15 = *(undefined8 *)(parent_node->m_centroid).m_s;
      uVar9 = 0;
      do {
        uVar3 = puVar4[uVar9];
        uVar19 = *(undefined8 *)ppVar6[uVar3].first.m_s;
        fVar14 = (float)uVar19 - (float)uVar15;
        fVar16 = (float)((ulong)uVar19 >> 0x20) - (float)((ulong)uVar15 >> 0x20);
        local_58 = CONCAT44(fVar16,fVar14);
        fVar17 = (float)ppVar6[uVar3].second;
        local_50 = CONCAT44(fVar17 * fVar16,fVar17 * fVar14);
        puVar10 = &local_50;
        puVar11 = &local_48;
        lVar8 = 0;
        do {
          fVar14 = *(float *)((long)&local_58 + lVar8 * 4);
          lVar12 = 0;
          do {
            *(float *)((long)puVar11 + lVar12 * 4) =
                 *(float *)((long)puVar10 + lVar12 * 4) * fVar14 +
                 *(float *)((long)puVar11 + lVar12 * 4);
            lVar1 = lVar8 + lVar12;
            lVar12 = lVar12 + 1;
          } while (lVar1 == 0);
          puVar11 = (undefined8 *)((long)puVar11 + 0xc);
          puVar10 = (undefined8 *)((long)puVar10 + 4);
          bVar13 = lVar8 == 0;
          lVar8 = lVar8 + 1;
        } while (bVar13);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
    }
    uVar5 = parent_node->m_total_weight;
    puVar10 = &local_48;
    lVar8 = 0;
    do {
      lVar12 = -1;
      do {
        *(float *)((long)puVar10 + lVar12 * 4 + 4) =
             *(float *)((long)puVar10 + lVar12 * 4 + 4) * (1.0 / (float)uVar5);
        lVar12 = lVar12 + 1;
      } while (lVar8 + lVar12 == 0);
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      bVar13 = lVar8 == 0;
      lVar8 = lVar8 + 1;
    } while (bVar13);
    uStack_40 = CONCAT44(uStack_40._4_4_,local_48._4_4_);
    local_58 = 0x3fa000003f400000;
    iVar7 = 0;
    uVar15 = 0x3fa000003f400000;
    uVar19 = 0x3fa000003f400000;
    do {
      fVar14 = 0.0;
      puVar10 = &local_48;
      lVar8 = 0;
      do {
        fVar16 = 0.0;
        lVar12 = 0;
        do {
          fVar16 = fVar16 + *(float *)((long)&local_58 + lVar12 * 4) *
                            *(float *)((long)puVar10 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 == 1);
        *(float *)((long)&local_50 + lVar8 * 4) = fVar16;
        if (fVar14 <= ABS(fVar16)) {
          fVar14 = ABS(fVar16);
        }
        puVar10 = puVar10 + 1;
        bVar13 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar13);
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        local_50 = CONCAT44((float)((ulong)local_50 >> 0x20) * (1.0 / fVar14),
                            (float)local_50 * (1.0 / fVar14));
      }
      fVar17 = (float)local_50;
      fVar14 = (float)uVar15 - fVar17;
      fVar20 = (float)((ulong)local_50 >> 0x20);
      fVar16 = (float)((ulong)uVar15 >> 0x20) - fVar20;
      local_58 = local_50;
    } while ((0.0025 <= fVar16 * fVar16 + fVar14 * fVar14) &&
            (iVar7 = iVar7 + 1, uVar15 = uVar19, uVar19 = local_50, iVar7 != 10));
    dVar22 = (double)(fVar20 * fVar20) + (double)(fVar17 * fVar17);
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      local_58 = CONCAT44((float)((ulong)local_58 >> 0x20) * (float)(1.0 / dVar22),
                          (float)local_58 * (float)(1.0 / dVar22));
    }
    dVar22 = 0.0;
    uVar5 = (ulong)(parent_node->m_vectors).m_size;
    if (uVar5 == 0) {
      fVar14 = 0.0;
      fVar16 = 0.0;
      uVar15 = 0;
      dVar18 = 0.0;
    }
    else {
      uVar19 = *(undefined8 *)(parent_node->m_centroid).m_s;
      dVar18 = 0.0;
      fVar14 = 0.0;
      fVar16 = 0.0;
      uVar9 = 0;
      uVar15 = 0;
      do {
        ppVar6 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar9];
        uVar2 = *(undefined8 *)(ppVar6->first).m_s;
        fVar17 = (float)ppVar6->second;
        dVar21 = (double)ppVar6->second;
        if (0.0 <= ((float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar19 >> 0x20)) *
                   (float)((ulong)local_58 >> 0x20) +
                   ((float)uVar2 - (float)uVar19) * (float)local_58) {
          uVar2 = *(undefined8 *)(ppVar6->first).m_s;
          uVar15 = CONCAT44((float)((ulong)uVar15 >> 0x20) + (float)((ulong)uVar2 >> 0x20) * fVar17,
                            (float)uVar15 + (float)uVar2 * fVar17);
          dVar18 = dVar18 + dVar21;
        }
        else {
          uVar2 = *(undefined8 *)(ppVar6->first).m_s;
          fVar14 = fVar14 + (float)uVar2 * fVar17;
          fVar16 = fVar16 + (float)((ulong)uVar2 >> 0x20) * fVar17;
          dVar22 = dVar22 + dVar21;
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    if ((dVar22 <= 0.0) || (dVar18 <= 0.0)) {
      compute_split_estimate(this,left_child_res,right_child_res,parent_node);
    }
    else {
      *(ulong *)left_child_res->m_s =
           CONCAT44(fVar16 * (float)(1.0 / dVar22),fVar14 * (float)(1.0 / dVar22));
      *(ulong *)right_child_res->m_s =
           CONCAT44((float)((ulong)uVar15 >> 0x20) * (float)(1.0 / dVar18),
                    (float)uVar15 * (float)(1.0 / dVar18));
    }
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }